

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O1

void __thiscall bwtil::cw_bwt::build(cw_bwt *this)

{
  symbol s;
  symbol s_00;
  ulint uVar1;
  BackwardIterator *pBVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long *plVar6;
  ostream *poVar7;
  ulint uVar8;
  ulint uVar9;
  ulint uVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> context_char;
  allocator_type local_6d;
  int local_6c;
  ulint local_68;
  ulong local_60;
  long local_58;
  ContextAutomata *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  uVar1 = this->n;
  pBVar2 = this->bwIt;
  (this->ca).current_state = 0;
  (*pBVar2->_vptr_BackwardIterator[2])();
  uVar10 = (this->ca).current_state;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_48,(ulong)this->k,&local_6d);
  if (this->k != 0) {
    uVar5 = 0;
    do {
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = '\0';
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->k);
  }
  if (this->verbose != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "\n*** Main cw-bwt algorithm (context-wise incremental construction of the BWT) *** "
               ,0x52);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    plVar6 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
  }
  local_50 = &this->ca;
  local_58 = -uVar1;
  local_6c = -1;
  local_68 = 0;
  local_60 = uVar1;
  while( true ) {
    local_60 = local_60 - 1;
    iVar3 = (*this->bwIt->_vptr_BackwardIterator[4])();
    if ((char)iVar3 != '\0') break;
    iVar3 = (int)(((local_58 + this->n) * 100) / this->n);
    if ((local_6c < iVar3 && iVar3 * -0x33333333 + 0x19999999U < 0x33333333) &&
       (this->verbose == true)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"% done.",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      local_6c = iVar3;
    }
    uVar4 = (*this->bwIt->_vptr_BackwardIterator[3])();
    s = (symbol)(this->ca).remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar4 & 0xff];
    uVar5 = local_60 % (ulong)this->k;
    s_00 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[uVar5];
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar5] = s;
    ContextAutomata::goTo(local_50,s);
    uVar1 = (this->ca).current_state;
    PartialSums::increment
              ((this->partial_sums).
               super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
               super__Vector_impl_data._M_start + uVar1,s_00);
    uVar8 = PartialSums::getCount
                      ((this->partial_sums).
                       super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar1,s_00);
    uVar9 = DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::rank
                      ((this->dynStrings).
                       super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10,s,local_68);
    DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::insert
              ((this->dynStrings).
               super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar10,s,local_68);
    local_68 = uVar9 + uVar8;
    local_58 = local_58 + 1;
    uVar10 = uVar1;
  }
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::insert
            ((this->dynStrings).
             super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar10,this->TERMINATOR,local_68);
  (*this->bwIt->_vptr_BackwardIterator[5])();
  if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Done.",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void build(){

		ulint pos = n-1;//current position on text (char to be inserted in the bwt)
		ulint terminator_context,terminator_pos, new_terminator_context,new_terminator_pos;//coordinates of the terminator character

		ca.rewind();//go back to first state
		bwIt->rewind();

		//context of length k before position n (excluded):
		terminator_context = ca.currentState();//context
		vector<symbol> context_char = vector<symbol>(k);//context in char format

		for(uint i=0;i<k;i++)
			context_char[i] = 0;

		//memorize position of the terminator
		terminator_pos = 0;

		//now start main algorithm

		symbol head,tail;//head=symbol to be inserted, tail=symbol exiting from the context

		if(verbose) cout << "\n*** Main cw-bwt algorithm (context-wise incremental construction of the BWT) *** " << endl << endl;

		int perc,last_percentage=-1;

		/*ulint char_inserted = 0;
		vector<double> times;

	    using std::chrono::high_resolution_clock;
	    using std::chrono::duration_cast;
	    using std::chrono::duration;

	    auto t1 = high_resolution_clock::now();*/

		while(not bwIt->begin()){

			perc = (100*(n-pos-1))/n;

			if((perc%5==0) and (perc>last_percentage) and verbose){
				cout << " " << perc << "% done." << endl;
				last_percentage = perc;
			}

			head = ca.ASCIItoCode( bwIt->read() );//this symbol has context corresponding to ca.currentState(). symbol entering from left in context
			tail = context_char[pos%k];// = (pos+k)%k . Symbol exiting from right of the context

			context_char[pos%k] = head;//buffer head symbol, overwriting the symbol exiting from tail of the context

			ca.goTo(head);
			new_terminator_context = ca.currentState();

			//substitute the terminator with the symbol head (coordinates terminator_context,terminator_pos)

			partial_sums[new_terminator_context].increment(tail);

			new_terminator_pos = partial_sums[new_terminator_context].getCount(tail) +  dynStrings[terminator_context].rank(head,terminator_pos);

			dynStrings[terminator_context].insert(head,terminator_pos);

			//update terminator coordinates

			terminator_context = new_terminator_context;
			terminator_pos = new_terminator_pos;

			/*{//print also time benchmarks

				//number of chars processed until now
				char_inserted = n-pos;

				//sample time every 500k chars
				if(char_inserted%500000==0)
					times.push_back( duration_cast<duration<double, std::ratio<1>>>(high_resolution_clock::now() - t1).count() );

			}*/


			pos--;

		}

		dynStrings[terminator_context].insert(TERMINATOR,terminator_pos);//insert the terminator character

		bwIt->close();//close input file

		if(verbose) cout << " Done." << endl;

		/*{//print time benchmarks

			cout << "\nRunning times (seconds) every 500k characters:" << endl;

			for(ulint i=0;i<times.size();i++)
				cout << times.at(i) << "\n";

			cout << endl;

		}*/

	}